

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void anon_unknown.dwarf_8b1c::do_encode_decode_lt_test<int>(int ekey1,int ekey2)

{
  pointer pbVar1;
  pointer pbVar2;
  size_t *this;
  undefined8 os;
  size_t sVar3;
  int iVar4;
  int iVar5;
  __extent_storage<18446744073709551615UL> val1;
  unsigned_long shared_length;
  pointer __n;
  char *pcVar6;
  uint uVar7;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  undefined1 local_5d8 [8];
  key_encoder enc2;
  key_encoder enc1;
  stringstream ss2;
  detail local_398 [112];
  ios_base aiStack_328 [264];
  internal local_220 [8];
  AssertionResult gtest_ar;
  ios_base aiStack_1a0 [264];
  uint local_98;
  undefined4 uStack_94;
  int akey1;
  long local_88 [2];
  AssertHelper local_78;
  size_t local_70;
  ostream *local_68;
  int local_60;
  int local_5c;
  int ekey1_local;
  int ekey2_local;
  long local_50;
  long local_48 [2];
  Message local_38;
  int akey2;
  
  local_60 = ekey1;
  local_5c = ekey2;
  testing::internal::CmpHelperNE<int,int>(local_220,"(ekey1)","(ekey2)",&local_60,&local_5c);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)&enc1.off);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&enc2.off,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x3f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&enc2.off,(Message *)&enc1.off);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&enc2.off);
    if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  this = &enc2.off;
  memset(this,0,0x118);
  enc1.buf = &DAT_00000100;
  enc1.cap = 0;
  enc1.ibuf._248_8_ = this;
  memset(local_5d8,0,0x118);
  iVar4 = local_60;
  enc2.buf = &DAT_00000100;
  enc2.cap = 0;
  enc2.ibuf._248_8_ = local_5d8;
  unodb::key_encoder::ensure_available((key_encoder *)this,4);
  iVar5 = local_5c;
  uVar7 = iVar4 + 0x80000000;
  *(uint *)(enc1.ibuf._248_8_ + enc1.cap) =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | iVar4 << 0x18;
  local_68 = (ostream *)enc1.ibuf._248_8_;
  local_70 = enc1.cap;
  pbVar1 = (pointer)(enc1.cap + 4);
  enc1.cap = (size_t)pbVar1;
  unodb::key_encoder::ensure_available((key_encoder *)local_5d8,4);
  sVar3 = enc2.cap;
  os = enc2.ibuf._248_8_;
  uVar7 = iVar5 + 0x80000000;
  *(uint *)(enc2.ibuf._248_8_ + enc2.cap) =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | iVar5 << 0x18;
  pbVar2 = (pointer)(enc2.cap + 4);
  enc1.off._0_4_ = 0;
  ekey1_local = 0;
  enc2.cap = (size_t)pbVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_220,"(compare(ikey1, ikey1))","(0)",(int *)&enc1.off,&ekey1_local);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)&enc1.off);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ekey1_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x45,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
    if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  enc1.off._0_4_ = 0;
  ekey1_local = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_220,"(compare(ikey2, ikey2))","(0)",(int *)&enc1.off,&ekey1_local);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)&enc1.off);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ekey1_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x46,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
    if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  __n = pbVar1;
  if (pbVar2 < pbVar1) {
    __n = pbVar2;
  }
  enc1.off._0_4_ = memcmp(local_68,(void *)os,(size_t)__n);
  if (((uint)enc1.off == 0) && (enc1.off._0_4_ = 0, local_70 != sVar3)) {
    enc1.off._0_4_ = -(uint)(pbVar1 < pbVar2) | 1;
  }
  val1._M_extent_value = (size_t)&enc1.off;
  ekey1_local = 0;
  testing::internal::CmpHelperNE<int,int>
            (local_220,"(compare(ikey1, ikey2))","(0)",(int *)val1._M_extent_value,&ekey1_local);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)&enc1.off);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    val1._M_extent_value = 0x47;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ekey1_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x47,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
    if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  uVar7 = memcmp(local_68,(void *)os,(size_t)__n);
  if ((uVar7 == 0) && (uVar7 = 0, local_70 != sVar3)) {
    uVar7 = -(uint)(pbVar1 < pbVar2) | 1;
  }
  if ((int)uVar7 < 0) {
    enc1.off._0_4_ = memcmp((void *)os,local_68,(size_t)__n);
    if (((uint)enc1.off == 0) && (enc1.off._0_4_ = 0, sVar3 != local_70)) {
      enc1.off._0_4_ = -(uint)(pbVar2 < pbVar1) | 1;
    }
    ekey1_local = 0;
    testing::internal::CmpHelperGT<int,int>
              (local_220,"(compare(ikey2, ikey1))","(0)",(int *)&enc1.off,&ekey1_local);
    if (local_220[0] == (internal)0x0) {
      testing::Message::Message((Message *)&enc1.off);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ekey1_local,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x58,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
      if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    uVar7 = *(uint *)local_68 ^ 0x80;
    local_98 = *(uint *)local_68 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
               uVar7 << 0x18;
    uVar7 = *(uint *)os ^ 0x80;
    local_38.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         *(uint *)os >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    testing::internal::CmpHelperEQ<int,int>
              (local_220,"(ekey1)","(akey1)",&local_60,(int *)&local_98);
    if (local_220[0] == (internal)0x0) {
      testing::Message::Message((Message *)&enc1.off);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ekey1_local,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x60,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
      if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    testing::internal::CmpHelperEQ<int,int>
              (local_220,"(ekey2)","(akey2)",&local_5c,(int *)&local_38);
    if (local_220[0] == (internal)0x0) {
      testing::Message::Message((Message *)&enc1.off);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ekey1_local,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x61,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ekey1_local,(Message *)&enc1.off);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey1_local);
      if ((long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(enc1.off._4_4_,(uint)enc1.off) + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_220);
    std::__cxx11::stringstream::stringstream((stringstream *)&enc1.off);
    key._M_extent._M_extent_value = val1._M_extent_value;
    key._M_ptr = pbVar1;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)&gtest_ar.message_,local_68,key);
    key_00._M_extent._M_extent_value = val1._M_extent_value;
    key_00._M_ptr = pbVar2;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              (local_398,(ostream *)os,key_00);
    testing::Message::Message(&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),"ikey1 < ikey2",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),": ekey1(",8);
    std::ostream::operator<<
              ((void *)(CONCAT44(local_38.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 (uint)local_38.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl) + 0x10),local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),")[",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),(char *)CONCAT44(ekey2_local,ekey1_local),
               local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),", ekey2(",8);
    std::ostream::operator<<
              ((void *)(CONCAT44(local_38.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 (uint)local_38.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl) + 0x10),local_5c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),")[",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),(char *)CONCAT44(uStack_94,local_98),_akey1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) + 0x10),"]",1);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x51,"Failed");
    testing::internal::AssertHelper::operator=(&local_78,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(uStack_94,local_98) != local_88) {
      operator_delete((long *)CONCAT44(uStack_94,local_98),local_88[0] + 1);
    }
    if ((long *)CONCAT44(ekey2_local,ekey1_local) != local_48) {
      operator_delete((long *)CONCAT44(ekey2_local,ekey1_local),local_48[0] + 1);
    }
    if ((long *)CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_38.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_38.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&enc1.off);
    std::ios_base::~ios_base(aiStack_328);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_220);
    std::ios_base::~ios_base(aiStack_1a0);
  }
  if (&DAT_00000100 < enc2.buf) {
    free((void *)enc2.ibuf._248_8_);
  }
  if (&DAT_00000100 < enc1.buf) {
    free((void *)enc1.ibuf._248_8_);
  }
  return;
}

Assistant:

void do_encode_decode_lt_test(const T ekey1, const T ekey2) {
  if constexpr (std::is_same_v<T, float> || std::is_same_v<T, double>) {
    // Note: floating point +0 and -0 compare as equal, so we do not
    // compare the keys for non-quality if one of the keys is zero.
    if (std::fpclassify(ekey1) != FP_ZERO) {
      UNODB_EXPECT_NE(ekey1, ekey2);  // not the same ekey.
    }
  } else {
    UNODB_EXPECT_NE(ekey1, ekey2);  // not the same ekey.
  }
  unodb::key_encoder enc1{};
  unodb::key_encoder enc2{};  // separate decoder (backed by different span).
  const auto ikey1 = enc1.encode(ekey1).get_key_view();  // into encoder buf!
  const auto ikey2 = enc2.encode(ekey2).get_key_view();  // into encoder buf!
  UNODB_EXPECT_EQ(compare(ikey1, ikey1), 0);             // compare w/ self
  UNODB_EXPECT_EQ(compare(ikey2, ikey2), 0);             // compare w/ self
  UNODB_EXPECT_NE(compare(ikey1, ikey2), 0);             // not the same ikey.
  // Check the core assertion for this test helper. The internal keys
  // (after encoding) obey the asserted ordering over the external
  // keys (before encoding).
  if (!(compare(ikey1, ikey2) < 0)) {
    // LCOV_EXCL_START
    std::stringstream ss1;
    std::stringstream ss2;
    unodb::detail::dump_key(ss1, ikey1);
    unodb::detail::dump_key(ss2, ikey2);
    FAIL() << "ikey1 < ikey2"
           << ": ekey1(" << ekey1 << ")[" << ss1.str() << "]"
           << ", ekey2(" << ekey2 << ")[" << ss2.str() << "]";
    // LCOV_EXCL_START
  }
  // Verify key2 > key1
  // NOLINTNEXTLINE(readability/check)
  UNODB_EXPECT_GT(compare(ikey2, ikey1), 0);
  // Verify that we can round trip both values.
  unodb::key_decoder dec1{ikey1};
  unodb::key_decoder dec2{ikey2};
  T akey1;
  T akey2;
  dec1.decode(akey1);
  dec2.decode(akey2);
  UNODB_EXPECT_EQ(ekey1, akey1);
  UNODB_EXPECT_EQ(ekey2, akey2);
}